

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O0

void __thiscall DROPlayer::DoCommand_v1(DROPlayer *this)

{
  uint uVar1;
  UINT16 UVar2;
  UINT32 UVar3;
  byte local_11;
  UINT8 curCmd;
  DROPlayer *this_local;
  
  uVar1 = this->_filePos;
  UVar3 = DataLoader_GetSize(this->_dLoad);
  if (UVar3 <= uVar1) {
    DoFileEnd(this);
    return;
  }
  local_11 = this->_fileData[this->_filePos];
  this->_filePos = this->_filePos + 1;
  switch(local_11) {
  case 0:
    this->_fileTick = this->_fileData[this->_filePos] + 1 + this->_fileTick;
    this->_filePos = this->_filePos + 1;
    return;
  case 1:
    if ((this->_initBlkEndOfs <= this->_filePos) &&
       (((this->_fileData[this->_filePos] & 0xdf) != 0 ||
        ((this->_fileData[this->_filePos + 1] != '\b' &&
         (this->_fileData[this->_filePos + 1] < 0x20)))))) {
      UVar2 = ReadLE16(this->_fileData + this->_filePos);
      this->_fileTick = UVar2 + 1 + this->_fileTick;
      this->_filePos = this->_filePos + 2;
      return;
    }
    break;
  case 2:
  case 3:
    this->_selPort = local_11 & 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_devTypes);
    return;
  case 4:
    if ((this->_fileData[this->_filePos] < 8) && (this->_initBlkEndOfs <= this->_filePos)) {
      local_11 = this->_fileData[this->_filePos];
      this->_filePos = this->_filePos + 1;
    }
  }
  WriteReg(this,this->_selPort,local_11,this->_fileData[this->_filePos]);
  this->_filePos = this->_filePos + 1;
  return;
}

Assistant:

void DROPlayer::DoCommand_v1(void)
{
	if (_filePos >= DataLoader_GetSize(_dLoad))
	{
		DoFileEnd();
		return;
	}
	
	UINT8 curCmd;
	
	//emu_logf(&_logger, PLRLOG_TRACE, "[DRO v1] Ofs %04X, Command %02X data %02X\n", _filePos, _fileData[_filePos], _fileData[_filePos+1]);
	curCmd = _fileData[_filePos];
	_filePos ++;
	switch(curCmd)
	{
	case 0x00:	// 1-byte delay
		_fileTick += 1 + _fileData[_filePos];
		_filePos ++;
		return;
	case 0x01:	// 2-byte delay
		// Note: With DRO v1, the DOSBox developers wanted to change this command from 0x01 to 0x10.
		//       Too bad that they updated the documentation, but not the actual code.
		if (_filePos < _initBlkEndOfs)
			break;	// assume missing escape command during initialization block
		if (! (_fileData[_filePos + 0x00] & ~0x20) &&
			(_fileData[_filePos + 0x01] == 0x08 || _fileData[_filePos + 0x01] >= 0x20))
			break;	// This is an unescaped register write. (e.g. 01 20 08 xx or 01 00 BD C0)
		
		_fileTick += 1 + ReadLE16(&_fileData[_filePos]);
		_filePos += 0x02;
		return;
	case 0x02:	// use 1st OPL2 chip / 1st OPL3 port
	case 0x03:	// use 2nd OPL2 chip / 2nd OPL3 port
		_selPort = curCmd & 0x01;
		if (_selPort >= (_devTypes.size() << _portShift))
		{
			//emu_logf(&_logger, PLRLOG_WARN, "More chips used than defined in header!\n");
			//_shownMsgs[2] = true;
		}
		return;
	case 0x04:	// escape command
		// Note: This command is used by various tools that edit DRO files, but DOSBox itself doesn't write it.
		if (_fileData[_filePos] >= 0x08)
			break;	// It only makes sense to escape register 00..04, so should be a direct write to register 04.
		if (_filePos < _initBlkEndOfs)
			break;	// assume missing escape command during initialization block
		
		// read the next value and treat it as register value
		curCmd = _fileData[_filePos];
		_filePos ++;
		break;
	}
	
	WriteReg(_selPort, curCmd, _fileData[_filePos]);
	_filePos ++;
	
	return;
}